

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * parse_function_call(ParserState *parser,StringObject *methodname,int line)

{
  int iVar1;
  LexerState *ls_00;
  AstNode *pAVar2;
  AstNode *pAVar3;
  AstNode *string_expr;
  AstNode *table_expr;
  AstNode *call_expr;
  LexerState *ls;
  int line_local;
  StringObject *methodname_local;
  ParserState *parser_local;
  
  ls_00 = parser->ls;
  pAVar2 = allocate_expr_ast_node(parser,EXPR_FUNCTION_CALL);
  (pAVar2->field_2).function_call_expr.method_name = methodname;
  (pAVar2->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (pAVar2->field_2).function_call_expr.num_results = 1;
  set_type((VariableType *)&(pAVar2->field_2).return_stmt,RAVI_TANY);
  iVar1 = (ls_00->t).token;
  if (iVar1 == 0x28) {
    raviX_next(ls_00);
    if ((ls_00->t).token != 0x29) {
      parse_expression_list(parser,&(pAVar2->field_2).for_stmt.for_statement_list);
      set_multireturn(parser,(pAVar2->field_2).for_stmt.for_statement_list,false);
    }
    check_match(ls_00,0x29,0x28,line);
  }
  else if (iVar1 == 0x7b) {
    pAVar3 = parse_table_constructor(parser);
    add_ast_node(parser->compiler_state,&(pAVar2->field_2).for_stmt.for_statement_list,pAVar3);
  }
  else if (iVar1 == 0x130) {
    pAVar3 = new_literal_expression(parser,RAVI_TSTRING);
    (pAVar3->field_2).function_stmt.function_expr = (AstNode *)(ls_00->t).seminfo;
    add_ast_node(parser->compiler_state,&(pAVar2->field_2).for_stmt.for_statement_list,pAVar3);
    raviX_next(ls_00);
  }
  else {
    raviX_syntaxerror(ls_00,"function arguments expected");
  }
  return pAVar2;
}

Assistant:

static AstNode *parse_function_call(ParserState *parser, const StringObject *methodname,
					    int line)
{
	LexerState *ls = parser->ls;
	AstNode *call_expr = allocate_expr_ast_node(parser, EXPR_FUNCTION_CALL);
	call_expr->function_call_expr.method_name = methodname;
	call_expr->function_call_expr.arg_list = NULL;
	call_expr->function_call_expr.num_results = 1; /* By default we expect one arg */
	set_type(&call_expr->function_call_expr.type, RAVI_TANY);
	switch (ls->t.token) {
	case '(': { /* funcargs -> '(' [ explist ] ')' */
		raviX_next(ls);
		if (ls->t.token == ')') /* arg list is empty? */
			;
		else {
			parse_expression_list(parser, &call_expr->function_call_expr.arg_list);
			set_multireturn(parser, call_expr->function_call_expr.arg_list, false);
		}
		check_match(ls, ')', '(', line);
		break;
	}
	case '{': { /* funcargs -> constructor */
		AstNode *table_expr = parse_table_constructor(parser);
		add_ast_node(parser->compiler_state, &call_expr->function_call_expr.arg_list, table_expr);
		break;
	}
	case TOK_STRING: { /* funcargs -> STRING */
		AstNode *string_expr = new_literal_expression(parser, RAVI_TSTRING);
		string_expr->literal_expr.u.ts = ls->t.seminfo.ts;
		add_ast_node(parser->compiler_state, &call_expr->function_call_expr.arg_list, string_expr);
		raviX_next(ls);
		break;
	}
	default: {
		raviX_syntaxerror(ls, "function arguments expected");
	}
	}
	return call_expr;
}